

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O3

void __thiscall
memory::
Array<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>::
Array<std::allocator<int>>
          (Array<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
           *this,vector<int,_std::allocator<int>_> *other)

{
  int iVar1;
  long lVar2;
  size_t __size;
  void *ptr;
  ConstArrayView<value_type,_HostCoordinator<value_type,_Allocator<int,_AlignedPolicy<8UL>_>_>_>
  local_30;
  
  local_30.pointer_ =
       (other->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  __size = (long)(other->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)local_30.pointer_;
  if (__size == 0) {
    local_30._0_8_ = 0;
    lVar2 = 0;
  }
  else {
    iVar1 = posix_memalign((void **)&local_30,8,__size);
    if (iVar1 != 0) {
      local_30._0_8_ = 0;
    }
    local_30.pointer_ =
         (other->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_start;
    lVar2 = (long)(other->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)local_30.pointer_;
  }
  *(undefined8 *)(this + 8) = local_30._0_8_;
  *(long *)(this + 0x10) = (long)__size >> 2;
  local_30.size_ = lVar2 >> 2;
  HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>::
  copy<memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>
            ((HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>> *)
             (this + 0x18),&local_30,
             (ArrayView<value_type,_HostCoordinator<value_type,_Allocator<int,_AlignedPolicy<8UL>_>_>_>
              *)this);
  return;
}

Assistant:

Array(std::vector<value_type, Allocator> const& other)
    : base(coordinator_type().allocate(other.size()))
    {
        coordinator_.copy(
            const_view_type(other.data(), other.size()),
            *this
        );
    }